

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall const::$_0::operator()(wasm::Type)::HeapType__(void *this,HeapType *heapType)

{
  ulong uVar1;
  FeatureSet FVar2;
  RecGroup RVar3;
  uint uVar4;
  pointer pTVar5;
  Signature SVar6;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_48;
  Type local_30;
  Type child;
  
  uVar1 = heapType->id;
  if (uVar1 < 0xe) {
    switch(uVar1 & 0xffffffff) {
    case 0:
    case 1:
    case 0xb:
    case 0xc:
    case 0xd:
      *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 1;
      return;
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
      *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 5;
      return;
    case 7:
    case 8:
    case 9:
    case 10:
      *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 0x81;
      return;
    }
    if (0xd < uVar1) goto LAB_009cb25a;
LAB_009cb2e0:
    RVar3 = ::wasm::HeapType::getRecGroup(heapType);
    if (((RVar3.id & 1) == 0) && (8 < (ulong)(*(long *)(RVar3.id + 8) - *(long *)RVar3.id)))
    goto LAB_009cb260;
    uVar1 = heapType->id;
    if (uVar1 < 0xe) goto LAB_009cb26b;
    if (*(long *)(uVar1 + 8) != 0) goto LAB_009cb260;
    if ((uVar1 < 0xe) || (*(int *)(uVar1 + 0x20) != 1)) goto LAB_009cb26b;
    *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 1;
    SVar6 = ::wasm::HeapType::getSignature(heapType);
    if ((SVar6.results.id.id < 7) || (*(int *)(SVar6.results.id.id + 4) != 0)) goto LAB_009cb26b;
    uVar4 = 0x200;
  }
  else {
LAB_009cb25a:
    if ((*(int *)(uVar1 + 0x20) != 2) && ((uVar1 < 0xe || (*(int *)(uVar1 + 0x20) != 3))))
    goto LAB_009cb2e0;
LAB_009cb260:
    uVar4 = 0x500;
  }
  *(uint *)((long)this + 0x54) = *(uint *)((long)this + 0x54) | uVar4;
LAB_009cb26b:
  ::wasm::HeapType::getTypeChildren(&local_48,heapType);
  if (local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar5 = local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_30.id = pTVar5->id;
      if ((local_30.id < 7) || (*(int *)(local_30.id + 4) != 1)) {
        FVar2 = ::wasm::Type::getFeatures(&local_30);
        *(uint *)((long)this + 0x54) = *(uint *)((long)this + 0x54) | FVar2.features;
      }
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void noteChild(HeapType* heapType) {
          if (heapType->isBasic()) {
            switch (heapType->getBasic()) {
              case HeapType::ext:
              case HeapType::func:
                feats |= FeatureSet::ReferenceTypes;
                return;
              case HeapType::any:
              case HeapType::eq:
              case HeapType::i31:
              case HeapType::struct_:
              case HeapType::array:
                feats |= FeatureSet::ReferenceTypes | FeatureSet::GC;
                return;
              case HeapType::string:
              case HeapType::stringview_wtf8:
              case HeapType::stringview_wtf16:
              case HeapType::stringview_iter:
                feats |= FeatureSet::ReferenceTypes | FeatureSet::Strings;
                return;
              case HeapType::none:
              case HeapType::noext:
              case HeapType::nofunc:
                // Technically introduced in GC, but used internally as part of
                // ref.null with just reference types.
                feats |= FeatureSet::ReferenceTypes;
                return;
            }
          }

          if (heapType->isStruct() || heapType->isArray() ||
              heapType->getRecGroup().size() > 1 || heapType->getSuperType()) {
            feats |= FeatureSet::ReferenceTypes | FeatureSet::GC;
          } else if (heapType->isSignature()) {
            // This is a function reference, which requires reference types and
            // possibly also multivalue (if it has multiple returns). Note that
            // technically typed function references also require GC, however,
            // we use these types internally regardless of the presence of GC
            // (in particular, since during load of the wasm we don't know the
            // features yet, so we apply the more refined types), so we don't
            // add that in any case here.
            feats |= FeatureSet::ReferenceTypes;
            auto sig = heapType->getSignature();
            if (sig.results.isTuple()) {
              feats |= FeatureSet::Multivalue;
            }
          }

          // In addition, scan their non-ref children, to add dependencies on
          // things like SIMD.
          for (auto child : heapType->getTypeChildren()) {
            if (!child.isRef()) {
              feats |= child.getFeatures();
            }
          }
        }